

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_b<ncnn::BinaryOp_x86_avx_functor::binary_op_ratan2>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined8 uVar39;
  undefined8 uVar40;
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  float fVar54;
  float fVar55;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  undefined1 auVar56 [32];
  __m128 _outp_1;
  __m128 _p_1;
  __m128 _b;
  __m256 _outp;
  __m256 _p;
  __m256 _b_avx;
  int i;
  int size;
  binary_op_ratan2 op;
  __m256 special_result;
  __m256 negative_mask_full_x;
  __m256 normal_result;
  __m256 pi_additions;
  __m256 negative_mask_y;
  __m256 negative_mask_x;
  __m256 normal_mode;
  __m256 not_equal_zero_y;
  __m256 not_equal_zero_x;
  __m256 magic_half_pi;
  __m256 magic_pi;
  __m256 magic_negative_zero;
  __m256 magic_zero;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero_1;
  __m128 special_result_1;
  __m128 negative_mask_full_x_1;
  __m128 normal_result_1;
  __m128 pi_additions_1;
  __m128 negative_mask_y_1;
  __m128 negative_mask_x_1;
  __m128 normal_mode_1;
  __m128 not_equal_zero_y_1;
  __m128 not_equal_zero_x_1;
  __m128 magic_half_pi_2;
  __m128 magic_pi_1;
  __m128 magic_negative_zero_2;
  __m128 magic_zero_1;
  __m128 output_approx_1;
  __m128 fourth_power_of_input_approx_1;
  __m128 square_of_input_approx_1;
  __m128 input_approx_1;
  __m128 is_small_input_1;
  __m128 absolute_1;
  __m128 negative_mask_1;
  __m128 magic_a8_1;
  __m128 magic_a7_1;
  __m128 magic_a6_1;
  __m128 magic_a5_1;
  __m128 magic_a4_1;
  __m128 magic_a3_1;
  __m128 magic_a2_1;
  __m128 magic_a1_1;
  __m128 magic_a0_1;
  __m128 magic_half_pi_3;
  __m128 magic_negative_one_1;
  __m128 magic_one_1;
  __m128 magic_negative_zero_3;
  undefined8 local_2670;
  undefined8 uStack_2668;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  int local_25d4;
  undefined8 *local_25c0;
  undefined1 (*local_25b0) [32];
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  float local_22e0;
  float fStack_22dc;
  float fStack_22d8;
  float fStack_22d4;
  float fStack_22d0;
  float fStack_22cc;
  float fStack_22c8;
  float fStack_22c4;
  float local_22c0;
  float fStack_22bc;
  float fStack_22b8;
  float fStack_22b4;
  float fStack_22b0;
  float fStack_22ac;
  float fStack_22a8;
  float fStack_22a4;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  float local_1a40;
  float fStack_1a3c;
  float fStack_1a38;
  float fStack_1a34;
  float fStack_1a30;
  float fStack_1a2c;
  float fStack_1a28;
  float fStack_1a24;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  float local_15e0;
  float fStack_15dc;
  float fStack_15d8;
  float fStack_15d4;
  float fStack_15d0;
  float fStack_15cc;
  float fStack_15c8;
  float fStack_15c4;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float local_1420;
  float fStack_141c;
  float fStack_1418;
  float fStack_1414;
  float fStack_1410;
  float fStack_140c;
  float fStack_1408;
  float local_1380;
  float fStack_137c;
  float fStack_1378;
  float fStack_1374;
  float fStack_1370;
  float fStack_136c;
  float fStack_1368;
  float local_12e0;
  float fStack_12dc;
  float fStack_12d8;
  float fStack_12d4;
  float fStack_12d0;
  float fStack_12cc;
  float fStack_12c8;
  float local_12a0;
  float fStack_129c;
  float fStack_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float local_1240;
  float fStack_123c;
  float fStack_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float fStack_1190;
  float fStack_118c;
  float fStack_1188;
  float local_1100;
  float fStack_10fc;
  float fStack_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  float fStack_10e8;
  float local_10c0;
  float fStack_10bc;
  float fStack_10b8;
  float fStack_10b4;
  float fStack_10b0;
  float fStack_10ac;
  float fStack_10a8;
  uint local_de0;
  uint uStack_ddc;
  uint uStack_dd8;
  uint uStack_dd4;
  uint uStack_dd0;
  uint uStack_dcc;
  uint uStack_dc8;
  uint uStack_dc4;
  float local_c30;
  float fStack_c2c;
  float fStack_c28;
  float fStack_c24;
  float local_c20;
  float fStack_c1c;
  float fStack_c18;
  float fStack_c14;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  
  local_25d4 = 0;
  uVar1 = *in_RSI;
  auVar13 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar1),0x20);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(uVar1),0x30);
  auVar14 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar1),0x20);
  auVar14 = vinsertps_avx(auVar14,ZEXT416(uVar1),0x30);
  uStack_2510 = auVar13._0_8_;
  uStack_2508 = auVar13._8_8_;
  local_25c0 = in_RDX;
  local_25b0 = in_RDI;
  for (; local_25d4 + 7 < in_ECX * in_R8D; local_25d4 = local_25d4 + 8) {
    auVar53._16_8_ = uStack_2510;
    auVar53._0_16_ = auVar14;
    auVar53._24_8_ = uStack_2508;
    auVar52._16_8_ = uStack_2510;
    auVar52._0_16_ = auVar14;
    auVar52._24_8_ = uStack_2508;
    auVar51._16_8_ = uStack_2510;
    auVar51._0_16_ = auVar14;
    auVar51._24_8_ = uStack_2508;
    auVar7._16_8_ = uStack_2510;
    auVar7._0_16_ = auVar14;
    auVar7._24_8_ = uStack_2508;
    auVar13 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x20);
    auVar13 = vinsertps_avx(auVar13,ZEXT416(0),0x30);
    auVar15 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0),0x20);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0),0x30);
    uStack_2270 = auVar15._0_8_;
    uStack_2268 = auVar15._8_8_;
    auVar15 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x20);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x30);
    auVar16 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x80000000),0x20);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x80000000),0x30);
    uStack_2230 = auVar16._0_8_;
    uStack_2228 = auVar16._8_8_;
    auVar16 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40490fdb),0x20);
    auVar16 = vinsertps_avx(auVar16,ZEXT416(0x40490fdb),0x30);
    auVar17 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x40490fdb),0x20);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x40490fdb),0x30);
    uStack_21f0 = auVar17._0_8_;
    uStack_21e8 = auVar17._8_8_;
    auVar17 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3fc90fdb),0x20);
    auVar17 = vinsertps_avx(auVar17,ZEXT416(0x3fc90fdb),0x30);
    auVar18 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3fc90fdb),0x20);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3fc90fdb),0x30);
    uStack_21b0 = auVar18._0_8_;
    uStack_21a8 = auVar18._8_8_;
    auVar6._16_8_ = uStack_2270;
    auVar6._0_16_ = auVar13;
    auVar6._24_8_ = uStack_2268;
    auVar6 = vcmpps_avx(*local_25b0,auVar6,4);
    auVar2._16_8_ = uStack_2270;
    auVar2._0_16_ = auVar13;
    auVar2._24_8_ = uStack_2268;
    auVar7 = vcmpps_avx(auVar7,auVar2,4);
    auVar6 = vandps_avx(auVar6,auVar7);
    auVar10._16_8_ = uStack_2230;
    auVar10._0_16_ = auVar15;
    auVar10._24_8_ = uStack_2228;
    auVar2 = vandps_avx(auVar10,*local_25b0);
    auVar5._16_8_ = uStack_2230;
    auVar5._0_16_ = auVar15;
    auVar5._24_8_ = uStack_2228;
    auVar3 = vandps_avx(auVar5,auVar51);
    auVar9._16_8_ = uStack_2270;
    auVar9._0_16_ = auVar13;
    auVar9._24_8_ = uStack_2268;
    auVar8 = vcmpps_avx(*local_25b0,auVar9,1);
    auVar9 = vcmpps_avx(auVar52,auVar9,1);
    auVar4._16_8_ = uStack_2230;
    auVar4._0_16_ = auVar15;
    auVar4._24_8_ = uStack_2228;
    auVar9 = vandps_avx(auVar9,auVar4);
    auVar42._16_8_ = uStack_21f0;
    auVar42._0_16_ = auVar16;
    auVar42._24_8_ = uStack_21e8;
    auVar9 = vorps_avx(auVar9,auVar42);
    auVar9 = vandps_avx(auVar8,auVar9);
    auVar12 = vdivps_avx(auVar53,*local_25b0);
    auVar15 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x20);
    auVar15 = vinsertps_avx(auVar15,ZEXT416(0x80000000),0x30);
    auVar18 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x80000000),0x20);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x80000000),0x30);
    uStack_19b0 = auVar18._0_8_;
    uStack_19a8 = auVar18._8_8_;
    auVar18 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x20);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x30);
    auVar19 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3f800000),0x20);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0x3f800000),0x30);
    uStack_1970 = auVar19._0_8_;
    uStack_1968 = auVar19._8_8_;
    auVar19 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbf800000),0x20);
    auVar19 = vinsertps_avx(auVar19,ZEXT416(0xbf800000),0x30);
    auVar20 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar20 = vinsertps_avx(auVar20,ZEXT416(0xbf800000),0x20);
    auVar20 = vinsertps_avx(auVar20,ZEXT416(0xbf800000),0x30);
    uStack_1930 = auVar20._0_8_;
    uStack_1928 = auVar20._8_8_;
    auVar20 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x20);
    auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x30);
    auVar21 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3fc90fdb),0x20);
    auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3fc90fdb),0x30);
    uStack_18f0 = auVar21._0_8_;
    uStack_18e8 = auVar21._8_8_;
    auVar21 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x20);
    auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x30);
    auVar22 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x20);
    auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x30);
    auVar23 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbeaaaa53),0x20);
    auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbeaaaa53),0x30);
    auVar24 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar24 = vinsertps_avx(auVar24,ZEXT416(0xbeaaaa53),0x20);
    auVar24 = vinsertps_avx(auVar24,ZEXT416(0xbeaaaa53),0x30);
    auVar25 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3e4cb974),0x20);
    auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3e4cb974),0x30);
    auVar26 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar26 = vinsertps_avx(auVar26,ZEXT416(0x3e4cb974),0x20);
    auVar26 = vinsertps_avx(auVar26,ZEXT416(0x3e4cb974),0x30);
    auVar27 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbe117200),0x20);
    auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbe117200),0x30);
    auVar28 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar28 = vinsertps_avx(auVar28,ZEXT416(0xbe117200),0x20);
    auVar28 = vinsertps_avx(auVar28,ZEXT416(0xbe117200),0x30);
    auVar29 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3dd9ed24),0x20);
    auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3dd9ed24),0x30);
    auVar30 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar30 = vinsertps_avx(auVar30,ZEXT416(0x3dd9ed24),0x20);
    auVar30 = vinsertps_avx(auVar30,ZEXT416(0x3dd9ed24),0x30);
    auVar31 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbd99b01e),0x20);
    auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbd99b01e),0x30);
    auVar32 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar32 = vinsertps_avx(auVar32,ZEXT416(0xbd99b01e),0x20);
    auVar32 = vinsertps_avx(auVar32,ZEXT416(0xbd99b01e),0x30);
    auVar33 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3d2edd4e),0x20);
    auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3d2edd4e),0x30);
    auVar34 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar34 = vinsertps_avx(auVar34,ZEXT416(0x3d2edd4e),0x20);
    auVar34 = vinsertps_avx(auVar34,ZEXT416(0x3d2edd4e),0x30);
    auVar35 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar35 = vinsertps_avx(auVar35,ZEXT416(0xbc83a25c),0x20);
    auVar35 = vinsertps_avx(auVar35,ZEXT416(0xbc83a25c),0x30);
    auVar36 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar36 = vinsertps_avx(auVar36,ZEXT416(0xbc83a25c),0x20);
    auVar36 = vinsertps_avx(auVar36,ZEXT416(0xbc83a25c),0x30);
    auVar37 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar37 = vinsertps_avx(auVar37,ZEXT416(0x3b3ac537),0x20);
    auVar37 = vinsertps_avx(auVar37,ZEXT416(0x3b3ac537),0x30);
    auVar38 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar38 = vinsertps_avx(auVar38,ZEXT416(0x3b3ac537),0x20);
    auVar38 = vinsertps_avx(auVar38,ZEXT416(0x3b3ac537),0x30);
    auVar46._16_8_ = uStack_19b0;
    auVar46._0_16_ = auVar15;
    auVar46._24_8_ = uStack_19a8;
    auVar8 = vandps_avx(auVar46,auVar12);
    auVar49._16_8_ = uStack_19b0;
    auVar49._0_16_ = auVar15;
    auVar49._24_8_ = uStack_19a8;
    auVar10 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
    auVar4 = vandnps_avx(auVar49,auVar12);
    auVar43._16_8_ = uStack_1970;
    auVar43._0_16_ = auVar18;
    auVar43._24_8_ = uStack_1968;
    auVar11 = vcmpps_avx(auVar43,auVar4,1);
    auVar45._16_8_ = uStack_1930;
    auVar45._0_16_ = auVar19;
    auVar45._24_8_ = uStack_1928;
    auVar12 = vandps_avx(auVar11,auVar45);
    auVar5 = vandnps_avx(auVar11,auVar4);
    auVar5 = vorps_avx(auVar12,auVar5);
    auVar12 = vandps_avx(auVar11,auVar4);
    auVar48._16_8_ = uStack_1970;
    auVar48._0_16_ = auVar18;
    auVar48._24_8_ = uStack_1968;
    auVar4 = vandnps_avx(auVar11,auVar48);
    auVar12 = vorps_avx(auVar12,auVar4);
    auVar12 = vdivps_avx(auVar5,auVar12);
    local_15e0 = auVar12._0_4_;
    fStack_15dc = auVar12._4_4_;
    fStack_15d8 = auVar12._8_4_;
    fStack_15d4 = auVar12._12_4_;
    fStack_15d0 = auVar12._16_4_;
    fStack_15cc = auVar12._20_4_;
    fStack_15c8 = auVar12._24_4_;
    fStack_15c4 = auVar12._28_4_;
    fVar54 = local_15e0 * local_15e0;
    fVar57 = fStack_15dc * fStack_15dc;
    fVar59 = fStack_15d8 * fStack_15d8;
    fVar61 = fStack_15d4 * fStack_15d4;
    fVar63 = fStack_15d0 * fStack_15d0;
    fVar65 = fStack_15cc * fStack_15cc;
    fVar67 = fStack_15c8 * fStack_15c8;
    fVar55 = fVar54 * fVar54;
    fVar58 = fVar57 * fVar57;
    fVar60 = fVar59 * fVar59;
    fVar62 = fVar61 * fVar61;
    fVar64 = fVar63 * fVar63;
    fVar66 = fVar65 * fVar65;
    fVar68 = fVar67 * fVar67;
    local_10c0 = auVar35._0_4_;
    fStack_10bc = auVar35._4_4_;
    fStack_10b8 = auVar35._8_4_;
    fStack_10b4 = auVar35._12_4_;
    fStack_10b0 = auVar36._0_4_;
    fStack_10ac = auVar36._4_4_;
    fStack_10a8 = auVar36._8_4_;
    local_1100 = auVar31._0_4_;
    fStack_10fc = auVar31._4_4_;
    fStack_10f8 = auVar31._8_4_;
    fStack_10f4 = auVar31._12_4_;
    fStack_10f0 = auVar32._0_4_;
    fStack_10ec = auVar32._4_4_;
    fStack_10e8 = auVar32._8_4_;
    local_11a0 = auVar27._0_4_;
    fStack_119c = auVar27._4_4_;
    fStack_1198 = auVar27._8_4_;
    fStack_1194 = auVar27._12_4_;
    fStack_1190 = auVar28._0_4_;
    fStack_118c = auVar28._4_4_;
    fStack_1188 = auVar28._8_4_;
    local_1240 = auVar23._0_4_;
    fStack_123c = auVar23._4_4_;
    fStack_1238 = auVar23._8_4_;
    fStack_1234 = auVar23._12_4_;
    fStack_1230 = auVar24._0_4_;
    fStack_122c = auVar24._4_4_;
    fStack_1228 = auVar24._8_4_;
    local_12a0 = auVar37._0_4_;
    fStack_129c = auVar37._4_4_;
    fStack_1298 = auVar37._8_4_;
    fStack_1294 = auVar37._12_4_;
    fStack_1290 = auVar38._0_4_;
    fStack_128c = auVar38._4_4_;
    fStack_1288 = auVar38._8_4_;
    local_12e0 = auVar33._0_4_;
    fStack_12dc = auVar33._4_4_;
    fStack_12d8 = auVar33._8_4_;
    fStack_12d4 = auVar33._12_4_;
    fStack_12d0 = auVar34._0_4_;
    fStack_12cc = auVar34._4_4_;
    fStack_12c8 = auVar34._8_4_;
    local_1380 = auVar29._0_4_;
    fStack_137c = auVar29._4_4_;
    fStack_1378 = auVar29._8_4_;
    fStack_1374 = auVar29._12_4_;
    fStack_1370 = auVar30._0_4_;
    fStack_136c = auVar30._4_4_;
    fStack_1368 = auVar30._8_4_;
    local_1420 = auVar25._0_4_;
    fStack_141c = auVar25._4_4_;
    fStack_1418 = auVar25._8_4_;
    fStack_1414 = auVar25._12_4_;
    fStack_1410 = auVar26._0_4_;
    fStack_140c = auVar26._4_4_;
    fStack_1408 = auVar26._8_4_;
    local_14c0 = auVar21._0_4_;
    fStack_14bc = auVar21._4_4_;
    fStack_14b8 = auVar21._8_4_;
    fStack_14b4 = auVar21._12_4_;
    fStack_14b0 = auVar22._0_4_;
    fStack_14ac = auVar22._4_4_;
    fStack_14a8 = auVar22._8_4_;
    auVar44._16_8_ = uStack_18f0;
    auVar44._0_16_ = auVar20;
    auVar44._24_8_ = uStack_18e8;
    auVar12 = vandps_avx(auVar11,auVar44);
    local_1a40 = auVar12._0_4_;
    fStack_1a3c = auVar12._4_4_;
    fStack_1a38 = auVar12._8_4_;
    fStack_1a34 = auVar12._12_4_;
    fStack_1a30 = auVar12._16_4_;
    fStack_1a2c = auVar12._20_4_;
    fStack_1a28 = auVar12._24_4_;
    fStack_1a24 = auVar12._28_4_;
    auVar47._4_4_ =
         (fVar57 * (fVar58 * (fVar58 * (fVar58 * fStack_10bc + fStack_10fc) + fStack_119c) +
                   fStack_123c) +
         fVar58 * (fVar58 * (fVar58 * (fVar58 * fStack_129c + fStack_12dc) + fStack_137c) +
                  fStack_141c) + fStack_14bc) * fStack_15dc + fStack_1a3c;
    auVar47._0_4_ =
         (fVar54 * (fVar55 * (fVar55 * (fVar55 * local_10c0 + local_1100) + local_11a0) + local_1240
                   ) +
         fVar55 * (fVar55 * (fVar55 * (fVar55 * local_12a0 + local_12e0) + local_1380) + local_1420)
         + local_14c0) * local_15e0 + local_1a40;
    auVar47._8_4_ =
         (fVar59 * (fVar60 * (fVar60 * (fVar60 * fStack_10b8 + fStack_10f8) + fStack_1198) +
                   fStack_1238) +
         fVar60 * (fVar60 * (fVar60 * (fVar60 * fStack_1298 + fStack_12d8) + fStack_1378) +
                  fStack_1418) + fStack_14b8) * fStack_15d8 + fStack_1a38;
    auVar47._12_4_ =
         (fVar61 * (fVar62 * (fVar62 * (fVar62 * fStack_10b4 + fStack_10f4) + fStack_1194) +
                   fStack_1234) +
         fVar62 * (fVar62 * (fVar62 * (fVar62 * fStack_1294 + fStack_12d4) + fStack_1374) +
                  fStack_1414) + fStack_14b4) * fStack_15d4 + fStack_1a34;
    auVar47._16_4_ =
         (fVar63 * (fVar64 * (fVar64 * (fVar64 * fStack_10b0 + fStack_10f0) + fStack_1190) +
                   fStack_1230) +
         fVar64 * (fVar64 * (fVar64 * (fVar64 * fStack_1290 + fStack_12d0) + fStack_1370) +
                  fStack_1410) + fStack_14b0) * fStack_15d0 + fStack_1a30;
    auVar47._20_4_ =
         (fVar65 * (fVar66 * (fVar66 * (fVar66 * fStack_10ac + fStack_10ec) + fStack_118c) +
                   fStack_122c) +
         fVar66 * (fVar66 * (fVar66 * (fVar66 * fStack_128c + fStack_12cc) + fStack_136c) +
                  fStack_140c) + fStack_14ac) * fStack_15cc + fStack_1a2c;
    auVar47._24_4_ =
         (fVar67 * (fVar68 * (fVar68 * (fVar68 * fStack_10a8 + fStack_10e8) + fStack_1188) +
                   fStack_1228) +
         fVar68 * (fVar68 * (fVar68 * (fVar68 * fStack_1288 + fStack_12c8) + fStack_1368) +
                  fStack_1408) + fStack_14a8) * fStack_15c8 + fStack_1a28;
    auVar47._28_4_ = fStack_15c4 + fStack_1a24;
    auVar8 = vorps_avx(auVar47,auVar8);
    local_22c0 = auVar8._0_4_;
    fStack_22bc = auVar8._4_4_;
    fStack_22b8 = auVar8._8_4_;
    fStack_22b4 = auVar8._12_4_;
    fStack_22b0 = auVar8._16_4_;
    fStack_22ac = auVar8._20_4_;
    fStack_22a8 = auVar8._24_4_;
    fStack_22a4 = auVar8._28_4_;
    local_22e0 = auVar9._0_4_;
    fStack_22dc = auVar9._4_4_;
    fStack_22d8 = auVar9._8_4_;
    fStack_22d4 = auVar9._12_4_;
    fStack_22d0 = auVar9._16_4_;
    fStack_22cc = auVar9._20_4_;
    fStack_22c8 = auVar9._24_4_;
    fStack_22c4 = auVar9._28_4_;
    auVar41._16_8_ = uStack_21f0;
    auVar41._0_16_ = auVar16;
    auVar41._24_8_ = uStack_21e8;
    auVar2 = vorps_avx(auVar2,auVar41);
    auVar8._16_8_ = uStack_2270;
    auVar8._0_16_ = auVar13;
    auVar8._24_8_ = uStack_2268;
    auVar9 = vcmpps_avx(auVar2,auVar8,1);
    auVar11._16_8_ = uStack_21b0;
    auVar11._0_16_ = auVar17;
    auVar11._24_8_ = uStack_21a8;
    auVar2 = vorps_avx(auVar3,auVar11);
    auVar2 = vandps_avx(auVar7,auVar2);
    auVar3._16_8_ = uStack_21f0;
    auVar3._0_16_ = auVar16;
    auVar3._24_8_ = uStack_21e8;
    auVar3 = vandps_avx(auVar9,auVar3);
    auVar50._16_8_ = uStack_2270;
    auVar50._0_16_ = auVar13;
    auVar50._24_8_ = uStack_2268;
    auVar9 = vandnps_avx(auVar9,auVar50);
    auVar3 = vorps_avx(auVar3,auVar9);
    auVar3 = vandnps_avx(auVar7,auVar3);
    auVar3 = vorps_avx(auVar2,auVar3);
    auVar12._4_4_ = fStack_22bc + fStack_22dc;
    auVar12._0_4_ = local_22c0 + local_22e0;
    auVar12._12_4_ = fStack_22b4 + fStack_22d4;
    auVar12._8_4_ = fStack_22b8 + fStack_22d8;
    auVar12._20_4_ = fStack_22ac + fStack_22cc;
    auVar12._16_4_ = fStack_22b0 + fStack_22d0;
    auVar12._28_4_ = fStack_22a4 + fStack_22c4;
    auVar12._24_4_ = fStack_22a8 + fStack_22c8;
    auVar2 = vandps_avx(auVar6,auVar12);
    local_de0 = auVar6._0_4_;
    uStack_ddc = auVar6._4_4_;
    uStack_dd8 = auVar6._8_4_;
    uStack_dd4 = auVar6._12_4_;
    uStack_dd0 = auVar6._16_4_;
    uStack_dcc = auVar6._20_4_;
    uStack_dc8 = auVar6._24_4_;
    uStack_dc4 = auVar6._28_4_;
    auVar56._0_4_ = local_de0 ^ auVar10._0_4_;
    auVar56._4_4_ = uStack_ddc ^ auVar10._4_4_;
    auVar56._8_4_ = uStack_dd8 ^ auVar10._8_4_;
    auVar56._12_4_ = uStack_dd4 ^ auVar10._12_4_;
    auVar56._16_4_ = uStack_dd0 ^ auVar10._16_4_;
    auVar56._20_4_ = uStack_dcc ^ auVar10._20_4_;
    auVar56._24_4_ = uStack_dc8 ^ auVar10._24_4_;
    auVar56._28_4_ = uStack_dc4 ^ auVar10._28_4_;
    auVar6 = vandps_avx(auVar56,auVar3);
    auVar6 = vorps_avx(auVar2,auVar6);
    local_2640 = auVar6._0_8_;
    uStack_2638 = auVar6._8_8_;
    uStack_2630 = auVar6._16_8_;
    uStack_2628 = auVar6._24_8_;
    *local_25c0 = local_2640;
    local_25c0[1] = uStack_2638;
    local_25c0[2] = uStack_2630;
    local_25c0[3] = uStack_2628;
    local_25b0 = local_25b0 + 1;
    local_25c0 = local_25c0 + 4;
  }
  uVar1 = *in_RSI;
  uVar39 = CONCAT44(uVar1,uVar1);
  uVar40 = CONCAT44(uVar1,uVar1);
  for (; local_25d4 + 3 < in_ECX * in_R8D; local_25d4 = local_25d4 + 4) {
    auVar32._8_8_ = uVar40;
    auVar32._0_8_ = uVar39;
    auVar31._8_8_ = uVar40;
    auVar31._0_8_ = uVar39;
    auVar30._8_8_ = uVar40;
    auVar30._0_8_ = uVar39;
    auVar14._8_8_ = uVar40;
    auVar14._0_8_ = uVar39;
    auVar13 = vcmpps_avx(*(undefined1 (*) [16])*local_25b0,ZEXT816(0),4);
    auVar14 = vcmpps_avx(auVar14,ZEXT816(0),4);
    auVar16 = vpand_avx(auVar13,auVar14);
    auVar18._8_8_ = 0x8000000080000000;
    auVar18._0_8_ = 0x8000000080000000;
    auVar17 = vpand_avx(auVar18,*(undefined1 (*) [16])*local_25b0);
    auVar15._8_8_ = 0x8000000080000000;
    auVar15._0_8_ = 0x8000000080000000;
    auVar18 = vpand_avx(auVar15,auVar30);
    auVar13 = vcmpps_avx(*(undefined1 (*) [16])*local_25b0,ZEXT816(0),1);
    auVar15 = vcmpps_avx(auVar31,ZEXT816(0),1);
    auVar19._8_8_ = 0x8000000080000000;
    auVar19._0_8_ = 0x8000000080000000;
    auVar15 = vpand_avx(auVar15,auVar19);
    auVar22._8_8_ = 0x40490fdb40490fdb;
    auVar22._0_8_ = 0x40490fdb40490fdb;
    auVar15 = vpor_avx(auVar15,auVar22);
    auVar19 = vpand_avx(auVar13,auVar15);
    auVar13 = vdivps_avx(auVar32,*(undefined1 (*) [16])*local_25b0);
    auVar23._8_8_ = 0x8000000080000000;
    auVar23._0_8_ = 0x8000000080000000;
    auVar20 = vpand_avx(auVar23,auVar13);
    auVar29._8_8_ = 0x8000000080000000;
    auVar29._0_8_ = 0x8000000080000000;
    auVar23 = vpcmpeqd_avx(auVar22,auVar22);
    auVar21 = vpandn_avx(auVar29,auVar13);
    auVar27._8_8_ = 0x3f8000003f800000;
    auVar27._0_8_ = 0x3f8000003f800000;
    auVar13 = vcmpps_avx(auVar27,auVar21,1);
    auVar25._8_8_ = 0xbf800000bf800000;
    auVar25._0_8_ = 0xbf800000bf800000;
    auVar15 = vpand_avx(auVar13,auVar25);
    auVar22 = vpandn_avx(auVar13,auVar21);
    auVar22 = vpor_avx(auVar15,auVar22);
    auVar15 = vpand_avx(auVar13,auVar21);
    auVar28._8_8_ = 0x3f8000003f800000;
    auVar28._0_8_ = 0x3f8000003f800000;
    auVar21 = vpandn_avx(auVar13,auVar28);
    auVar15 = vpor_avx(auVar15,auVar21);
    auVar15 = vdivps_avx(auVar22,auVar15);
    local_6d0 = auVar15._0_4_;
    fStack_6cc = auVar15._4_4_;
    fStack_6c8 = auVar15._8_4_;
    fStack_6c4 = auVar15._12_4_;
    fVar54 = local_6d0 * local_6d0;
    fVar57 = fStack_6cc * fStack_6cc;
    fVar59 = fStack_6c8 * fStack_6c8;
    fVar61 = fStack_6c4 * fStack_6c4;
    fVar55 = fVar54 * fVar54;
    fVar58 = fVar57 * fVar57;
    fVar60 = fVar59 * fVar59;
    fVar62 = fVar61 * fVar61;
    auVar24._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar24._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar13 = vpand_avx(auVar13,auVar24);
    local_740 = auVar13._0_4_;
    fStack_73c = auVar13._4_4_;
    fStack_738 = auVar13._8_4_;
    fStack_734 = auVar13._12_4_;
    auVar26._4_4_ =
         (fVar57 * (fVar58 * (fVar58 * (fVar58 * -0.01606863 + -0.07504295) + -0.14203644) +
                   -0.33333072) +
         fVar58 * (fVar58 * (fVar58 * (fVar58 * 0.0028498897 + 0.04269152) + 0.10640934) + 0.1999262
                  ) + 1.0) * fStack_6cc + fStack_73c;
    auVar26._0_4_ =
         (fVar54 * (fVar55 * (fVar55 * (fVar55 * -0.01606863 + -0.07504295) + -0.14203644) +
                   -0.33333072) +
         fVar55 * (fVar55 * (fVar55 * (fVar55 * 0.0028498897 + 0.04269152) + 0.10640934) + 0.1999262
                  ) + 1.0) * local_6d0 + local_740;
    auVar26._8_4_ =
         (fVar59 * (fVar60 * (fVar60 * (fVar60 * -0.01606863 + -0.07504295) + -0.14203644) +
                   -0.33333072) +
         fVar60 * (fVar60 * (fVar60 * (fVar60 * 0.0028498897 + 0.04269152) + 0.10640934) + 0.1999262
                  ) + 1.0) * fStack_6c8 + fStack_738;
    auVar26._12_4_ =
         (fVar61 * (fVar62 * (fVar62 * (fVar62 * -0.01606863 + -0.07504295) + -0.14203644) +
                   -0.33333072) +
         fVar62 * (fVar62 * (fVar62 * (fVar62 * 0.0028498897 + 0.04269152) + 0.10640934) + 0.1999262
                  ) + 1.0) * fStack_6c4 + fStack_734;
    auVar13 = vpor_avx(auVar26,auVar20);
    local_c20 = auVar13._0_4_;
    fStack_c1c = auVar13._4_4_;
    fStack_c18 = auVar13._8_4_;
    fStack_c14 = auVar13._12_4_;
    local_c30 = auVar19._0_4_;
    fStack_c2c = auVar19._4_4_;
    fStack_c28 = auVar19._8_4_;
    fStack_c24 = auVar19._12_4_;
    auVar21._8_8_ = 0x40490fdb40490fdb;
    auVar21._0_8_ = 0x40490fdb40490fdb;
    auVar13 = vpor_avx(auVar17,auVar21);
    auVar13 = vcmpps_avx(auVar13,ZEXT816(0),1);
    auVar20._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar20._0_8_ = 0x3fc90fdb3fc90fdb;
    auVar15 = vpor_avx(auVar18,auVar20);
    auVar15 = vpand_avx(auVar14,auVar15);
    auVar17._8_8_ = 0x40490fdb40490fdb;
    auVar17._0_8_ = 0x40490fdb40490fdb;
    auVar17 = vpand_avx(auVar13,auVar17);
    auVar13 = vpandn_avx(auVar13,ZEXT816(0));
    auVar13 = vpor_avx(auVar17,auVar13);
    auVar13 = vpandn_avx(auVar14,auVar13);
    auVar14 = vpor_avx(auVar15,auVar13);
    auVar13._4_4_ = fStack_c1c + fStack_c2c;
    auVar13._0_4_ = local_c20 + local_c30;
    auVar13._12_4_ = fStack_c14 + fStack_c24;
    auVar13._8_4_ = fStack_c18 + fStack_c28;
    auVar13 = vpand_avx(auVar16,auVar13);
    auVar14 = vpand_avx(auVar16 ^ auVar23,auVar14);
    auVar13 = vpor_avx(auVar13,auVar14);
    local_2670 = auVar13._0_8_;
    uStack_2668 = auVar13._8_8_;
    *local_25c0 = local_2670;
    local_25c0[1] = uStack_2668;
    local_25b0 = (undefined1 (*) [32])(*local_25b0 + 0x10);
    local_25c0 = local_25c0 + 2;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_b(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

    const int size = w * elempack;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _b_avx512 = _mm512_set1_ps(*ptr1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_avx512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    __m256 _b_avx = _mm256_set1_ps(*ptr1);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_avx);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    __m128 _b = _mm_set1_ps(*ptr1);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
}